

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  uint64_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  undefined8 in_RAX;
  vec<unsigned_int> *pvVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int i;
  undefined8 uStack_38;
  
  if (this->n_touched != 0) {
    iVar9 = 0;
    while( true ) {
      iVar2 = (this->subsumption_queue).end;
      iVar3 = (this->subsumption_queue).buf.sz;
      iVar4 = (this->subsumption_queue).first;
      iVar10 = 0;
      if (iVar2 < iVar4) {
        iVar10 = iVar3;
      }
      iVar10 = (iVar2 - iVar4) + iVar10;
      if (iVar10 <= iVar9) break;
      uVar5 = (this->subsumption_queue).buf.data[(iVar4 + iVar9) % iVar3];
      puVar6 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar7 = *(ulong *)(puVar6 + uVar5);
      if ((uVar7 & 3) == 0) {
        *(ulong *)(puVar6 + uVar5) = uVar7 | 2;
      }
      iVar9 = iVar9 + 1;
    }
    puVar1 = &(this->super_Solver).statistics.simpSteps;
    *puVar1 = *puVar1 + (long)iVar10;
    uStack_38 = in_RAX;
    for (iVar9 = 0; uStack_38 = CONCAT44(iVar9,(undefined4)uStack_38), iVar9 < (this->touched).sz;
        iVar9 = iVar9 + 1) {
      if ((this->touched).data[iVar9] != '\0') {
        pvVar8 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::
                 lookup(&this->occurs,(int *)((long)&uStack_38 + 4));
        for (lVar11 = 0; lVar11 < pvVar8->sz; lVar11 = lVar11 + 1) {
          if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory
               [pvVar8->data[lVar11]] & 3) == 0) {
            Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar8->data[lVar11]);
            puVar6 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
            *(ulong *)(puVar6 + pvVar8->data[lVar11]) =
                 *(ulong *)(puVar6 + pvVar8->data[lVar11]) & 0xfffffffffffffffc | 2;
          }
        }
        (this->touched).data[uStack_38._4_4_] = '\0';
        puVar1 = &(this->super_Solver).statistics.simpSteps;
        *puVar1 = *puVar1 + (long)pvVar8->sz;
        iVar9 = uStack_38._4_4_;
      }
    }
    iVar9 = 0;
    while( true ) {
      iVar2 = (this->subsumption_queue).end;
      iVar3 = (this->subsumption_queue).buf.sz;
      iVar4 = (this->subsumption_queue).first;
      iVar10 = 0;
      if (iVar2 < iVar4) {
        iVar10 = iVar3;
      }
      iVar10 = (iVar2 - iVar4) + iVar10;
      if (iVar10 <= iVar9) break;
      uVar5 = (this->subsumption_queue).buf.data[(iVar4 + iVar9) % iVar3];
      puVar6 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar7 = *(ulong *)(puVar6 + uVar5);
      if (((uint)uVar7 & 3) == 2) {
        *(ulong *)(puVar6 + uVar5) = uVar7 & 0xfffffffffffffffc;
      }
      iVar9 = iVar9 + 1;
    }
    puVar1 = &(this->super_Solver).statistics.simpSteps;
    *puVar1 = *puVar1 + (long)iVar10;
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i, j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0) ca[subsumption_queue[i]].mark(2);
    statistics.simpSteps += subsumption_queue.size();

    for (i = 0; i < touched.size(); i++)
        if (touched[i]) {
            const vec<CRef> &cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0) {
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
            statistics.simpSteps += cs.size();
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2) ca[subsumption_queue[i]].mark(0);
    statistics.simpSteps += subsumption_queue.size();

    n_touched = 0;
}